

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

Vec_Int_t * Saig_ManRetimeInitState(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  int *piVar4;
  void *pvVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  pVVar6 = (Vec_Int_t *)0x0;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s != (sat_solver *)0x0) {
    pVVar6 = (Vec_Int_t *)0x0;
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar3 == 1) {
      uVar1 = p->nObjs[2];
      p_01 = (Vec_Int_t *)malloc(0x10);
      uVar9 = (ulong)uVar1;
      if (uVar1 - 1 < 0xf) {
        uVar9 = 0x10;
      }
      p_01->nSize = 0;
      iVar3 = (int)uVar9;
      p_01->nCap = iVar3;
      if (iVar3 == 0) {
        piVar4 = (int *)0x0;
      }
      else {
        piVar4 = (int *)malloc((long)iVar3 << 2);
      }
      p_01->pArray = piVar4;
      lVar7 = 0;
      while( true ) {
        iVar3 = (int)lVar7;
        if (p->vCis->nSize <= iVar3) break;
        pvVar5 = Vec_PtrEntry(p->vCis,iVar3);
        iVar2 = p_00->pVarNums[*(int *)((long)pvVar5 + 0x24)];
        iVar8 = (int)uVar9;
        if (iVar3 == iVar8) {
          uVar10 = (ulong)(uint)(iVar8 * 2);
          if (iVar8 < 0x10) {
            uVar10 = 0x10;
          }
          if (iVar8 < (int)uVar10) {
            if (piVar4 == (int *)0x0) {
              piVar4 = (int *)malloc(uVar10 << 2);
            }
            else {
              piVar4 = (int *)realloc(piVar4,uVar10 << 2);
            }
            p_01->pArray = piVar4;
            if (piVar4 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_01->nCap = (int)uVar10;
            uVar9 = uVar10;
          }
        }
        p_01->nSize = (int)(lVar7 + 1);
        piVar4[lVar7] = iVar2;
        lVar7 = lVar7 + 1;
      }
      piVar4 = Sat_SolverGetModel(s,piVar4,iVar3);
      iVar3 = p->nObjs[2];
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nSize = iVar3;
      pVVar6->nCap = iVar3;
      pVVar6->pArray = piVar4;
      Vec_IntFree(p_01);
    }
    else if (iVar3 == 0) {
      __assert_fail("RetValue != l_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x43,"Vec_Int_t *Saig_ManRetimeInitState(Aig_Man_t *)");
    }
    sat_solver_delete(s);
  }
  Cnf_DataFree(p_00);
  return pVVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives the initial state after backward retiming.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManRetimeInitState( Aig_Man_t * p )
{
    int nConfLimit = 1000000;
    Vec_Int_t * vCiIds, * vInit = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i, RetValue, * pModel;
    // solve the SAT problem
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    // create counter-example
    if ( RetValue == l_True )
    {
        // accumulate SAT variables of the CIs
        vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
        // create the model
        pModel = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        vInit = Vec_IntAllocArray( pModel, Aig_ManCiNum(p) );
        Vec_IntFree( vCiIds );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return vInit;
}